

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O3

CoreObject * helics::getCoreObject(HelicsCore core,HelicsError *err)

{
  if (err == (HelicsError *)0x0) {
    if ((core != (HelicsCore)0x0) && (*(int *)((long)core + 0x44) == 0x378424ec)) {
      return (CoreObject *)core;
    }
  }
  else if (err->error_code == 0) {
    if ((core != (HelicsCore)0x0) && (*(int *)((long)core + 0x44) == 0x378424ec)) {
      return (CoreObject *)core;
    }
    err->error_code = -3;
    err->message = "core object is not valid";
  }
  return (CoreObject *)0x0;
}

Assistant:

CoreObject* getCoreObject(HelicsCore core, HelicsError* err) noexcept
{
    if ((err != nullptr) && (err->error_code != 0)) {
        return nullptr;
    }
    if (core == nullptr) {
        assignError(err, HELICS_ERROR_INVALID_OBJECT, invalidCoreString);
        return nullptr;
    }
    auto* coreObj = reinterpret_cast<helics::CoreObject*>(core);
    if (coreObj->valid == gCoreValidationIdentifier) {
        return coreObj;
    }
    assignError(err, HELICS_ERROR_INVALID_OBJECT, invalidCoreString);
    return nullptr;
}